

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (mxx *__return_storage_ptr__,impl *this,long begin,int param_4,comm *param_5,
          undefined8 param_6)

{
  undefined8 *puVar1;
  impl *piVar2;
  int iVar3;
  undefined8 uVar4;
  unsigned_long uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_type __new_size;
  long lVar9;
  ulong uVar10;
  long lVar11;
  pointer pTVar12;
  comm *comm;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> all_samples;
  size_t local_size;
  
  local_size = (begin - (long)this) / 0x18;
  comm = param_5;
  uVar5 = allreduce<unsigned_long,std::plus<unsigned_long>>
                    (&local_size,param_5,(begin - (long)this) % 0x18);
  iVar3 = param_5->m_size;
  lVar8 = (long)iVar3;
  lVar9 = (long)param_4;
  if (local_size == 0) {
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)(__return_storage_ptr__ + 8) = 0;
    *(undefined8 *)(__return_storage_ptr__ + 0x10) = 0;
  }
  else {
    uVar10 = (uVar5 + local_size * lVar9 * lVar8) - 1;
    __new_size = 1;
    if (uVar5 <= uVar10) {
      __new_size = uVar10 / uVar5;
    }
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)(__return_storage_ptr__ + 8) = 0;
    *(undefined8 *)(__return_storage_ptr__ + 0x10) = 0;
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
               __return_storage_ptr__,__new_size);
    lVar11 = 0;
    for (uVar10 = 0; comm = *(comm **)__return_storage_ptr__,
        uVar10 < (ulong)((*(long *)(__return_storage_ptr__ + 8) - (long)comm) / 0x18);
        uVar10 = uVar10 + 1) {
      lVar6 = (local_size / (__new_size + 1) + (ulong)(uVar10 < local_size % (__new_size + 1))) *
              0x18;
      *(undefined8 *)((long)&comm->m_size + lVar11) = *(undefined8 *)(this + lVar6 + -8);
      piVar2 = this + lVar6 + -0x18;
      uVar4 = *(undefined8 *)(piVar2 + 8);
      this = this + lVar6;
      puVar1 = (undefined8 *)((long)&comm->_vptr_comm + lVar11);
      *puVar1 = *(undefined8 *)piVar2;
      puVar1[1] = uVar4;
      lVar11 = lVar11 + 0x18;
    }
  }
  gatherv<TwoBSA<unsigned_long>>
            (&all_samples,__return_storage_ptr__,
             (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)0x0,
             (int)param_5,comm);
  if (param_5->m_rank == 0) {
    std::
    __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
              (all_samples.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               all_samples.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    if ((*(long *)(__return_storage_ptr__ + 8) - *(long *)__return_storage_ptr__) / 0x18 !=
        lVar8 + -1) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 __return_storage_ptr__,(long)(iVar3 + -1));
    }
    pTVar12 = all_samples.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar9 + -1;
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      lVar6 = *(long *)__return_storage_ptr__;
      uVar7 = (*(long *)(__return_storage_ptr__ + 8) - lVar6) / 0x18;
      if (uVar7 <= uVar10) break;
      *(unsigned_long *)(lVar6 + 0x10 + lVar11) = pTVar12->SA;
      uVar5 = pTVar12->B2;
      *(unsigned_long *)(lVar6 + lVar11) = pTVar12->B1;
      ((unsigned_long *)(lVar6 + lVar11))[1] = uVar5;
      uVar10 = uVar10 + 1;
      pTVar12 = pTVar12 + lVar9;
      lVar11 = lVar11 + 0x18;
    }
  }
  else {
    lVar6 = *(long *)__return_storage_ptr__;
    uVar7 = (*(long *)(__return_storage_ptr__ + 8) - lVar6) / 0x18;
  }
  if (uVar7 != lVar8 - 1U) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
               __return_storage_ptr__,lVar8 - 1);
    lVar6 = *(long *)__return_storage_ptr__;
    uVar7 = (*(long *)(__return_storage_ptr__ + 8) - lVar6) / 0x18;
  }
  MPI_Bcast(lVar6,uVar7 & 0xffffffff,param_6,0,param_5->mpi_comm);
  std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~_Vector_base
            (&all_samples.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>);
  return (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}